

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# src_sinc.c
# Opt level: O3

SRC_STATE * sinc_state_new(int converter_type,int channels,SRC_ERROR *error)

{
  double dVar1;
  double dVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  int iVar5;
  int iVar6;
  SRC_STATE *__ptr;
  SRC_STATE_VT *pSVar7;
  undefined4 *__ptr_00;
  ulong uVar8;
  void *pvVar9;
  SINC_FILTER *filter;
  SRC_ERROR SVar10;
  
  if (2 < (uint)converter_type) {
    __assert_fail("converter_type == SRC_SINC_FASTEST || converter_type == SRC_SINC_MEDIUM_QUALITY || converter_type == SRC_SINC_BEST_QUALITY"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/libsndfile[P]libsamplerate/src/src_sinc.c"
                  ,0x109,"SRC_STATE *sinc_state_new(int, int, SRC_ERROR *)");
  }
  if (channels < 1) {
    __assert_fail("channels > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/libsndfile[P]libsamplerate/src/src_sinc.c"
                  ,0x10a,"SRC_STATE *sinc_state_new(int, int, SRC_ERROR *)");
  }
  if (error == (SRC_ERROR *)0x0) {
    __assert_fail("error != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/libsndfile[P]libsamplerate/src/src_sinc.c"
                  ,0x10b,"SRC_STATE *sinc_state_new(int, int, SRC_ERROR *)");
  }
  if ((uint)channels < 0x81) {
    __ptr = (SRC_STATE *)calloc(1,0x50);
    SVar10 = SRC_ERR_MALLOC_FAILED;
    if (__ptr != (SRC_STATE *)0x0) {
      __ptr->channels = channels;
      if ((uint)channels < 7) {
        pSVar7 = (SRC_STATE_VT *)(&PTR_sinc_mono_state_vt_0026ddb0)[(char)((char)channels + -1)];
      }
      else {
        pSVar7 = &sinc_multichan_state_vt;
      }
      __ptr->vt = pSVar7;
      __ptr_00 = (undefined4 *)calloc(1,0x860);
      if (__ptr_00 != (undefined4 *)0x0) {
        *__ptr_00 = 0x26a5050;
        uVar8 = (ulong)(uint)converter_type;
        uVar3 = *(undefined4 *)(&DAT_0026b9c4 + uVar8 * 4);
        uVar4 = *(undefined4 *)(&DAT_0026b9d0 + uVar8 * 4);
        dVar1 = *(double *)(&DAT_0026b9f8 + uVar8 * 8);
        *(undefined **)(__ptr_00 + 0x10) = &DAT_0026b9b8 + *(int *)(&DAT_0026b9b8 + uVar8 * 4);
        __ptr_00[10] = uVar3;
        dVar2 = *(double *)(&DAT_0026b9e0 + uVar8 * 8);
        __ptr_00[0xb] = uVar4;
        iVar5 = (int)ROUND((dVar1 / dVar2) * 256.0 + 1.0);
        iVar6 = 0x1000;
        if (0x555 < iVar5) {
          iVar6 = iVar5 * 3;
        }
        iVar5 = iVar6 * channels + 1;
        __ptr_00[0x15] = iVar5;
        pvVar9 = calloc((ulong)(iVar6 * channels + channels + 1),4);
        *(void **)(__ptr_00 + 0x216) = pvVar9;
        if (pvVar9 != (void *)0x0) {
          __ptr->private_data = __ptr_00;
          __ptr_00[0x14] = 0xffffffff;
          memset((void *)((long)pvVar9 + (long)iVar5 * 4),0xaa,(ulong)(uint)(channels << 2));
          SVar10 = SRC_ERR_NO_ERROR;
          goto LAB_001032dc;
        }
        free(__ptr_00);
      }
      free(__ptr);
    }
  }
  else {
    SVar10 = SRC_ERR_BAD_CHANNEL_COUNT;
  }
  __ptr = (SRC_STATE *)0x0;
LAB_001032dc:
  *error = SVar10;
  return __ptr;
}

Assistant:

LIBSAMPLERATE_DLL_PRIVATE SRC_STATE *
sinc_state_new (int converter_type, int channels, SRC_ERROR *error)
{
	assert (converter_type == SRC_SINC_FASTEST ||
		converter_type == SRC_SINC_MEDIUM_QUALITY ||
		converter_type == SRC_SINC_BEST_QUALITY) ;
	assert (channels > 0) ;
	assert (error != NULL) ;

	if (channels > MAX_CHANNELS)
	{
		*error = SRC_ERR_BAD_CHANNEL_COUNT ;
		return NULL ;
	}

	SRC_STATE *state = (SRC_STATE *) calloc (1, sizeof (SRC_STATE)) ;
	if (!state)
	{
		*error = SRC_ERR_MALLOC_FAILED ;
		return NULL ;
	}

	state->channels = channels ;
	state->mode = SRC_MODE_PROCESS ;

	if (state->channels == 1)
		state->vt = &sinc_mono_state_vt ;
	else if (state->channels == 2)
		state->vt = &sinc_stereo_state_vt ;
	else if (state->channels == 4)
		state->vt = &sinc_quad_state_vt ;
	else if (state->channels == 6)
		state->vt = &sinc_hex_state_vt ;
	else
		state->vt = &sinc_multichan_state_vt ;

	state->private_data = sinc_filter_new (converter_type, state->channels) ;
	if (!state->private_data)
	{
		free (state) ;
		*error = SRC_ERR_MALLOC_FAILED ;
		return NULL ;
	}

	sinc_reset (state) ;

	*error = SRC_ERR_NO_ERROR ;

	return state ;
}